

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_gethostbyname.c
# Opt level: O1

void ares_gethostbyname_callback(void *arg,int status,int timeouts,ares_addrinfo *result)

{
  undefined4 uVar1;
  size_t sVar2;
  apattern *paVar3;
  bool bVar4;
  hostent *phVar5;
  ares_status_t aVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  undefined4 in_register_00000034;
  ulong uVar10;
  undefined4 uVar11;
  ulong uVar12;
  hostent *hostent;
  ares_in6_addr a2;
  ares_in6_addr a1;
  hostent *local_88;
  uint local_7c;
  int local_78;
  undefined4 local_74;
  undefined8 *local_70;
  ares_addrinfo *local_68;
  ulong local_60;
  anon_union_16_1_47ebf21e_for__S6_un local_58;
  anon_union_16_1_47ebf21e_for__S6_un local_48;
  
  uVar10 = CONCAT44(in_register_00000034,status);
  local_88 = (hostent *)0x0;
  if (status == 0) {
    aVar6 = ares_addrinfo2hostent(result,0,&local_88);
    uVar10 = (ulong)aVar6;
  }
  phVar5 = local_88;
  if ((local_88 != (hostent *)0x0 && (int)uVar10 == 0) &&
     ((local_88->h_addr_list == (char **)0x0 || (uVar10 = 0, *local_88->h_addr_list == (char *)0x0))
     )) {
    uVar10 = 1;
  }
  if ((int)uVar10 == 0) {
    sVar2 = *(size_t *)(*(long *)((long)arg + 0x10) + 0x50);
    if (sVar2 != 0 && local_88 != (hostent *)0x0) {
      local_7c = 0;
      local_78 = timeouts;
      local_70 = (undefined8 *)arg;
      local_68 = result;
      if (local_88->h_addrtype == 10) {
        pcVar9 = *local_88->h_addr_list;
        if (pcVar9 != (char *)0x0) {
          paVar3 = *(apattern **)(*(long *)((long)arg + 0x10) + 0x48);
          uVar10 = 0;
          do {
            local_48._0_8_ = *(undefined8 *)pcVar9;
            local_48._8_8_ = *(undefined8 *)(pcVar9 + 8);
            sVar7 = get6_address_index((ares_in6_addr *)&local_48,paVar3,sVar2);
            uVar12 = uVar10;
            if (uVar10 != 0) {
              do {
                local_58._0_8_ = *(undefined8 *)phVar5->h_addr_list[uVar12 - 1 & 0xffffffff];
                local_58._8_8_ = *(undefined8 *)(phVar5->h_addr_list[uVar12 - 1 & 0xffffffff] + 8);
                sVar8 = get6_address_index((ares_in6_addr *)&local_58,paVar3,sVar2);
                if (sVar8 <= sVar7) goto LAB_00110875;
                pcVar9 = phVar5->h_addr_list[uVar12];
                *(undefined8 *)pcVar9 = local_58._0_8_;
                *(undefined8 *)(pcVar9 + 8) = local_58._8_8_;
                bVar4 = 1 < (long)uVar12;
                uVar12 = uVar12 - 1;
              } while (bVar4);
              uVar12 = 0;
            }
LAB_00110875:
            pcVar9 = phVar5->h_addr_list[(int)uVar12];
            *(undefined8 *)pcVar9 = local_48._0_8_;
            *(undefined8 *)(pcVar9 + 8) = local_48._8_8_;
            pcVar9 = phVar5->h_addr_list[uVar10 + 1];
            uVar10 = uVar10 + 1;
          } while (pcVar9 != (char *)0x0);
        }
        uVar10 = (ulong)local_7c;
      }
      phVar5 = local_88;
      arg = local_70;
      result = local_68;
      timeouts = local_78;
      if (local_88->h_addrtype == 2) {
        pcVar9 = *local_88->h_addr_list;
        if (pcVar9 != (char *)0x0) {
          paVar3 = *(apattern **)(local_70[2] + 0x48);
          sVar2 = *(size_t *)(local_70[2] + 0x50);
          uVar10 = 0;
          do {
            uVar11 = *(undefined4 *)pcVar9;
            local_48._0_4_ = uVar11;
            sVar7 = get_address_index((in_addr *)&local_48,paVar3,sVar2);
            uVar12 = uVar10;
            if (uVar10 != 0) {
              do {
                local_60 = uVar12;
                local_74 = uVar11;
                uVar1 = *(undefined4 *)phVar5->h_addr_list[uVar10 - 1 & 0xffffffff];
                local_58._0_4_ = uVar1;
                sVar8 = get_address_index((in_addr *)&local_58,paVar3,sVar2);
                uVar12 = local_60;
                uVar11 = local_74;
                if (sVar8 <= sVar7) goto LAB_0011096b;
                *(undefined4 *)phVar5->h_addr_list[uVar10] = uVar1;
                bVar4 = 1 < (long)uVar10;
                uVar10 = uVar10 - 1;
              } while (bVar4);
              uVar10 = 0;
            }
LAB_0011096b:
            *(undefined4 *)phVar5->h_addr_list[(int)uVar10] = uVar11;
            pcVar9 = phVar5->h_addr_list[uVar12 + 1];
            uVar10 = uVar12 + 1;
          } while (pcVar9 != (char *)0x0);
        }
        uVar10 = (ulong)local_7c;
        arg = local_70;
        result = local_68;
        timeouts = local_78;
      }
    }
  }
  (**arg)(*(undefined8 *)((long)arg + 8),uVar10,timeouts,local_88);
  ares_freeaddrinfo(result);
  ares_free(arg);
  ares_free_hostent(local_88);
  return;
}

Assistant:

static void ares_gethostbyname_callback(void *arg, int status, int timeouts,
                                        struct ares_addrinfo *result)
{
  struct hostent    *hostent  = NULL;
  struct host_query *ghbn_arg = arg;

  if (status == ARES_SUCCESS) {
    status = (int)ares_addrinfo2hostent(result, AF_UNSPEC, &hostent);
  }

  /* addrinfo2hostent will only return ENODATA if there are no addresses _and_
   * no cname/aliases.  However, gethostbyname will return ENODATA even if there
   * is cname/alias data */
  if (status == ARES_SUCCESS && hostent &&
      (!hostent->h_addr_list || !hostent->h_addr_list[0])) {
    status = ARES_ENODATA;
  }

  if (status == ARES_SUCCESS && ghbn_arg->channel->nsort && hostent) {
    if (hostent->h_addrtype == AF_INET6) {
      sort6_addresses(hostent, ghbn_arg->channel->sortlist,
                      ghbn_arg->channel->nsort);
    }
    if (hostent->h_addrtype == AF_INET) {
      sort_addresses(hostent, ghbn_arg->channel->sortlist,
                     ghbn_arg->channel->nsort);
    }
  }

  ghbn_arg->callback(ghbn_arg->arg, status, timeouts, hostent);

  ares_freeaddrinfo(result);
  ares_free(ghbn_arg);
  ares_free_hostent(hostent);
}